

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::flipcertify
          (tetgenmesh *this,triface *chkface,badface **pqueue,point plane_pa,point plane_pb,
          point plane_pc)

{
  uint uVar1;
  tetrahedron *pppdVar2;
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  badface *pbVar3;
  int iVar4;
  badface *pbVar5;
  int iVar6;
  badface *pbVar7;
  long lVar8;
  badface *pbVar9;
  long lVar10;
  badface **ppbVar11;
  tetgenmesh *this_00;
  double dVar12;
  double w [5];
  point p [5];
  face checksh;
  double local_b8 [6];
  tetrahedron local_88 [6];
  face local_58;
  double local_48;
  
  local_58.sh = (shellface *)0x0;
  local_58.shver = 0;
  pppdVar2 = chkface->tet;
  uVar1 = chkface->ver;
  pb = pppdVar2[orgpivot[(int)uVar1]];
  local_88[0] = pb;
  pa = pppdVar2[destpivot[(int)uVar1]];
  local_88[1] = pa;
  pc = pppdVar2[apexpivot[(int)uVar1]];
  local_88[2] = pc;
  pd = pppdVar2[oppopivot[(int)uVar1]];
  local_88[3] = pd;
  pe = *(tetrahedron *)
        (((ulong)pppdVar2[uVar1 & 3] & 0xfffffffffffffff0) +
        (long)oppopivot[fsymtbl[(int)uVar1][(uint)pppdVar2[uVar1 & 3] & 0xf]] * 8);
  local_88[4] = pe;
  lVar10 = (long)this->pointmarkindex;
  iVar6 = 0;
  iVar4 = 0;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    uVar1 = *(uint *)((long)local_88[lVar8] + lVar10 * 4 + 4);
    iVar6 = iVar6 + (uint)((uVar1 >> 2 & 1) != 0);
    iVar4 = iVar4 + (uint)((uVar1 >> 3 & 1) != 0);
  }
  if (iVar4 == 0 || iVar6 == 0) {
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar1 = *(uint *)((long)local_88[lVar8 + 3] + lVar10 * 4 + 4);
      iVar6 = iVar6 + (uint)((uVar1 >> 2 & 1) != 0);
      iVar4 = iVar4 + (uint)((uVar1 >> 3 & 1) != 0);
    }
    if ((iVar6 != 0) && (iVar4 != 0)) {
      return;
    }
    if (pd == (tetrahedron)this->dummypoint) {
      return;
    }
    if (pe == (tetrahedron)this->dummypoint) {
      return;
    }
    tspivot(this,chkface,&local_58);
    if (local_58.sh != (shellface *)0x0) {
      return;
    }
    dVar12 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    if (dVar12 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar8 = (long)this->pointmarkindex;
      printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n",
             (ulong)*(uint *)((long)pb + lVar8 * 4),(ulong)*(uint *)((long)pa + lVar8 * 4),
             (ulong)*(uint *)((long)pc + lVar8 * 4),(ulong)*(uint *)((long)pd + lVar8 * 4),
             (ulong)*(uint *)((long)pe + lVar8 * 4));
    }
    pbVar5 = (badface *)memorypool::alloc(this->flippool);
    pbVar5->key = 0.0;
    (pbVar5->tt).tet = chkface->tet;
    (pbVar5->tt).ver = chkface->ver;
    pbVar5->forg = (point)pb;
    pbVar5->fdest = (point)pa;
    pbVar5->fapex = (point)pc;
    pbVar5->foppo = (point)pd;
    pbVar5->noppo = (point)pe;
    if (*pqueue != (badface *)0x0) {
      pbVar5->nextitem = *pqueue;
      *pqueue = pbVar5;
      return;
    }
    *pqueue = pbVar5;
  }
  else {
    this_00 = this;
    for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
      if ((*(byte *)((long)local_88[lVar8] + lVar10 * 4 + 4) & 4) == 0) {
        local_b8[lVar8] = 0.0;
      }
      else {
        dVar12 = orient3dfast(this_00,plane_pa,plane_pb,plane_pc,(double *)local_88[lVar8]);
        local_b8[lVar8] = dVar12;
        if (dVar12 < 0.0) {
          local_b8[lVar8] = -dVar12;
        }
      }
    }
    local_48 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    dVar12 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,local_b8[1],
                      local_b8[0],local_b8[2],local_b8[3],local_b8[4]);
    if (dVar12 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar8 = (long)this->pointmarkindex;
      printf("      Insert face (%d, %d, %d) - %d, %d\n",(ulong)*(uint *)((long)pb + lVar8 * 4),
             (ulong)*(uint *)((long)pa + lVar8 * 4),(ulong)*(uint *)((long)pc + lVar8 * 4),
             (ulong)*(uint *)((long)pd + lVar8 * 4),(ulong)*(uint *)((long)pe + lVar8 * 4));
    }
    pbVar5 = (badface *)memorypool::alloc(this->flippool);
    dVar12 = -local_48 / dVar12;
    pbVar5->key = dVar12;
    (pbVar5->tt).tet = chkface->tet;
    (pbVar5->tt).ver = chkface->ver;
    pbVar5->forg = (point)pb;
    pbVar5->fdest = (point)pa;
    pbVar5->fapex = (point)pc;
    pbVar5->foppo = (point)pd;
    pbVar5->noppo = (point)pe;
    if (*pqueue != (badface *)0x0) {
      pbVar3 = *pqueue;
      pbVar9 = (badface *)0x0;
      while ((pbVar7 = pbVar3, pbVar7 != (badface *)0x0 &&
             (pbVar7->key <= dVar12 && dVar12 != pbVar7->key))) {
        pbVar9 = pbVar7;
        pbVar3 = pbVar7->nextitem;
      }
      ppbVar11 = &pbVar9->nextitem;
      if (pbVar9 == (badface *)0x0) {
        ppbVar11 = pqueue;
      }
      *ppbVar11 = pbVar5;
      pbVar5->nextitem = pbVar7;
      return;
    }
    *pqueue = pbVar5;
  }
  pbVar5->nextitem = (badface *)0x0;
  return;
}

Assistant:

void tetgenmesh::flipcertify(triface *chkface,badface **pqueue,point plane_pa,
                             point plane_pb, point plane_pc)
{
  badface *parybf, *prevbf, *nextbf;
  triface neightet;
  face checksh;
  point p[5];
  REAL w[5];
  REAL insph, ori4;
  int topi, boti;
  int i;

  // Compute the flip time \tau.
  fsym(*chkface, neightet);

  p[0] = org(*chkface);
  p[1] = dest(*chkface);
  p[2] = apex(*chkface);
  p[3] = oppo(*chkface);
  p[4] = oppo(neightet);

  // Check if the face is a crossing face.
  topi = boti = 0;
  for (i = 0; i < 3; i++) {
    if (pmarktest2ed(p[i])) topi++;
    if (pmarktest3ed(p[i])) boti++;
  }
  if ((topi == 0) || (boti == 0)) {
    // It is not a crossing face.
    // return;
    for (i = 3; i < 5; i++) {
      if (pmarktest2ed(p[i])) topi++;
      if (pmarktest3ed(p[i])) boti++;
    }
    if ((topi == 0) || (boti == 0)) {
      // The two tets sharing at this face are on one side of the facet.
      // Check if this face is locally Delaunay (due to rounding error).
      if ((p[3] != dummypoint) && (p[4] != dummypoint)) {
        // Do not check it if it is a subface.
        tspivot(*chkface, checksh);
        if (checksh.sh == NULL) {
          insph = insphere_s(p[1], p[0], p[2], p[3], p[4]);
          if (insph > 0) {
            // Add the face into queue.
            if (b->verbose > 2) {
              printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n", 
                     pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                     pointmark(p[3]), pointmark(p[4]));
            }
            parybf = (badface *) flippool->alloc();
            parybf->key = 0.;  // tau = 0, do immediately.
            parybf->tt = *chkface;
            parybf->forg = p[0];
            parybf->fdest = p[1];
            parybf->fapex = p[2];
            parybf->foppo = p[3];
            parybf->noppo = p[4];
            // Add it at the top of the priority queue.
            if (*pqueue == NULL) {
              *pqueue = parybf;
              parybf->nextitem = NULL;
            } else {
              parybf->nextitem = *pqueue;
              *pqueue = parybf;
            }
          } // if (insph > 0)
        } // if (checksh.sh == NULL)
      }
    }
    return; // Test: omit this face.
  }

  // Decide the "height" for each point.
  for (i = 0; i < 5; i++) {
    if (pmarktest2ed(p[i])) {
      // A top point has a positive weight.
      w[i] = orient3dfast(plane_pa, plane_pb, plane_pc, p[i]);      
      if (w[i] < 0) w[i] = -w[i];
    } else {
      w[i] = 0;
    }
  }

  insph = insphere(p[1], p[0], p[2], p[3], p[4]);
  ori4 = orient4d(p[1], p[0], p[2], p[3], p[4], w[1], w[0], w[2], w[3], w[4]);
  if (ori4 > 0) {
    // Add the face into queue.
    if (b->verbose > 2) {
      printf("      Insert face (%d, %d, %d) - %d, %d\n", pointmark(p[0]),
        pointmark(p[1]), pointmark(p[2]), pointmark(p[3]), pointmark(p[4]));
    }
    
    parybf = (badface *) flippool->alloc();

    parybf->key = -insph / ori4;
    parybf->tt = *chkface;
    parybf->forg = p[0];
    parybf->fdest = p[1];
    parybf->fapex = p[2];
    parybf->foppo = p[3];
    parybf->noppo = p[4];

    // Push the face into priority queue.
    //pq.push(bface);
    if (*pqueue == NULL) {
      *pqueue = parybf;
      parybf->nextitem = NULL;
    } else {
      // Search an item whose key is larger or equal to current key.
      prevbf = NULL;
      nextbf = *pqueue;
      //if (!b->flipinsert_random) { // Default use a priority queue.
        // Insert the item into priority queue.
        while (nextbf != NULL) {
          if (nextbf->key < parybf->key) {
            prevbf = nextbf;
            nextbf = nextbf->nextitem;
          } else {
            break;
          }
        }
      //} // if (!b->flipinsert_random)
      // Insert the new item between prev and next items.
      if (prevbf == NULL) {
        *pqueue = parybf;
      } else {
        prevbf->nextitem = parybf;
      }
      parybf->nextitem = nextbf;
    }
  } else if (ori4 == 0) {
    
  }
}